

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateDtdFinal(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  _xmlDtd *p_Var1;
  xmlEntitiesTablePtr entities;
  xmlAttributeTablePtr table;
  xmlDtdPtr dtd;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  if ((doc == (xmlDocPtr)0x0) || (ctxt == (xmlValidCtxtPtr)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else if ((doc->intSubset == (_xmlDtd *)0x0) && (doc->extSubset == (_xmlDtd *)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    ctxt->doc = doc;
    ctxt->valid = 1;
    p_Var1 = doc->intSubset;
    if ((p_Var1 != (_xmlDtd *)0x0) && (p_Var1->attributes != (void *)0x0)) {
      xmlHashScan((xmlHashTablePtr)p_Var1->attributes,xmlValidateAttributeCallback,ctxt);
    }
    if ((p_Var1 != (_xmlDtd *)0x0) && (p_Var1->entities != (void *)0x0)) {
      xmlHashScan((xmlHashTablePtr)p_Var1->entities,xmlValidateNotationCallback,ctxt);
    }
    p_Var1 = doc->extSubset;
    if ((p_Var1 != (_xmlDtd *)0x0) && (p_Var1->attributes != (void *)0x0)) {
      xmlHashScan((xmlHashTablePtr)p_Var1->attributes,xmlValidateAttributeCallback,ctxt);
    }
    if ((p_Var1 != (_xmlDtd *)0x0) && (p_Var1->entities != (void *)0x0)) {
      xmlHashScan((xmlHashTablePtr)p_Var1->entities,xmlValidateNotationCallback,ctxt);
    }
    ctxt_local._4_4_ = ctxt->valid;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateDtdFinal(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlDtdPtr dtd;
    xmlAttributeTablePtr table;
    xmlEntitiesTablePtr entities;

    if ((doc == NULL) || (ctxt == NULL)) return(0);
    if ((doc->intSubset == NULL) && (doc->extSubset == NULL))
	return(0);
    ctxt->doc = doc;
    ctxt->valid = 1;
    dtd = doc->intSubset;
    if ((dtd != NULL) && (dtd->attributes != NULL)) {
	table = (xmlAttributeTablePtr) dtd->attributes;
	xmlHashScan(table, xmlValidateAttributeCallback, ctxt);
    }
    if ((dtd != NULL) && (dtd->entities != NULL)) {
	entities = (xmlEntitiesTablePtr) dtd->entities;
	xmlHashScan(entities, xmlValidateNotationCallback, ctxt);
    }
    dtd = doc->extSubset;
    if ((dtd != NULL) && (dtd->attributes != NULL)) {
	table = (xmlAttributeTablePtr) dtd->attributes;
	xmlHashScan(table, xmlValidateAttributeCallback, ctxt);
    }
    if ((dtd != NULL) && (dtd->entities != NULL)) {
	entities = (xmlEntitiesTablePtr) dtd->entities;
	xmlHashScan(entities, xmlValidateNotationCallback, ctxt);
    }
    return(ctxt->valid);
}